

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O2

void __thiscall BasicUUID_Out_Test::TestBody(BasicUUID_Out_Test *this)

{
  char *message;
  AssertHelper local_1c0;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  pstore::operator<<((ostream *)&str,&(this->super_BasicUUID).id_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[37],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"84949cc5-4701-4a84-895b-354c584a981b\"","str.str ()",
             (char (*) [37])"84949cc5-4701-4a84-895b-354c584a981b",&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  return;
}

Assistant:

TEST_F (BasicUUID, Out) {
    std::ostringstream str;
    str << id_;
    EXPECT_EQ ("84949cc5-4701-4a84-895b-354c584a981b", str.str ());
}